

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphGenerator.cpp
# Opt level: O0

void __thiscall GraphGenerator::Generate(GraphGenerator *this,int n,double density,double eps)

{
  int iVar1;
  ulong uVar2;
  pair<int,_int> local_50;
  size_t local_48;
  size_t cur;
  int j;
  int i;
  size_t den;
  size_t tot;
  double eps_local;
  double density_local;
  GraphGenerator *pGStack_10;
  int n_local;
  GraphGenerator *this_local;
  
  tot = (size_t)eps;
  eps_local = density;
  density_local._4_4_ = n;
  pGStack_10 = this;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear(&this->edges);
  uVar2 = (ulong)(1.0 / (double)tot);
  den = uVar2 | (long)(1.0 / (double)tot - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  _j = (ulong)(eps_local / (double)tot);
  _j = _j | (long)(eps_local / (double)tot - 9.223372036854776e+18) & (long)_j >> 0x3f;
  for (cur._4_4_ = 0; iVar1 = cur._4_4_, cur._4_4_ < (int)density_local._4_4_;
      cur._4_4_ = cur._4_4_ + 1) {
    while (cur._0_4_ = iVar1 + 1, (int)cur < (int)density_local._4_4_) {
      local_48 = randRange(this,0,(int)den);
      iVar1 = (int)cur;
      if (local_48 < _j) {
        local_50 = std::make_pair<int&,int&>((int *)((long)&cur + 4),(int *)&cur);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (&this->edges,&local_50);
        iVar1 = (int)cur;
      }
    }
  }
  (**this->_vptr_GraphGenerator)(this,(ulong)density_local._4_4_);
  return;
}

Assistant:

void GraphGenerator::Generate(int n, double density, double eps) {
	edges.clear();
	size_t tot = 1 / eps;
	size_t den = density / eps;
	for (int i = 0; i < n; i++) {
		for (int j = i + 1; j < n; j++) {
			size_t cur = randRange(0, tot);
			if (cur < den) edges.push_back(make_pair(i, j));
		}
	}
	this -> output(n);
}